

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_envs.cxx
# Opt level: O0

void __thiscall xray_re::xr_sound_env_object::load(xr_sound_env_object *this,xr_reader *r)

{
  size_t sVar1;
  unsigned_short local_1a;
  xr_reader *pxStack_18;
  uint16_t version;
  xr_reader *r_local;
  xr_sound_env_object *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  sVar1 = xr_reader::r_chunk<unsigned_short>(r,0x1001,&local_1a);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_envs.cxx"
                  ,0x11,"virtual void xray_re::xr_sound_env_object::load(xr_reader &)");
  }
  if (local_1a == 0x12) {
    xr_custom_object::load((xr_custom_object *)this,pxStack_18);
    sVar1 = xr_reader::find_chunk(pxStack_18,0x1003);
    if (sVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_envs.cxx"
                    ,0x15,"virtual void xray_re::xr_sound_env_object::load(xr_reader &)");
    }
    xr_reader::r_sz(pxStack_18,&this->m_inner);
    xr_reader::r_sz(pxStack_18,&this->m_outer);
    xr_reader::debug_find_chunk(pxStack_18);
    return;
  }
  __assert_fail("version == SOUNDENV_VERSION",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_envs.cxx"
                ,0x12,"virtual void xray_re::xr_sound_env_object::load(xr_reader &)");
}

Assistant:

void xr_sound_env_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(SOUNDENV_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SOUNDENV_VERSION);
	xr_custom_object::load(r);
	if (!r.find_chunk(SOUNDENV_CHUNK_ENV_REFS))
		xr_not_expected();
	r.r_sz(m_inner);
	r.r_sz(m_outer);
	r.debug_find_chunk();
}